

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O3

sds * duckdb_hll::sdssplitlen(char *s,ssize_t len,char *sep,int seplen,int *count)

{
  int iVar1;
  sds *__ptr;
  sds *ppcVar2;
  sds pcVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  uVar9 = (ulong)(uint)seplen;
  if (-1 < len && 0 < seplen) {
    __ptr = (sds *)malloc(0x28);
    iVar6 = 0;
    if (__ptr != (sds *)0x0) {
      if (len != 0) {
        if ((long)(ulong)(seplen - 1) < len) {
          lVar8 = 0;
          iVar6 = 5;
          lVar7 = 0;
          uVar5 = 0;
          do {
            ppcVar2 = __ptr;
            if (iVar6 < (int)(uVar5 + 2)) {
              iVar6 = iVar6 * 2;
              ppcVar2 = (sds *)realloc(__ptr,(long)iVar6 << 3);
              if (ppcVar2 == (sds *)0x0) goto LAB_018560fd;
            }
            __ptr = ppcVar2;
            if (((seplen == 1) && (s[lVar8] == *sep)) ||
               (iVar1 = bcmp(s + lVar8,sep,uVar9), lVar4 = lVar8, iVar1 == 0)) {
              pcVar3 = sdsnewlen(s + lVar7,lVar8 - lVar7);
              __ptr[(int)uVar5] = pcVar3;
              if (pcVar3 == (sds)0x0) goto LAB_018560fd;
              uVar5 = uVar5 + 1;
              lVar4 = uVar9 + lVar8 + -1;
              lVar7 = lVar8 + uVar9;
            }
            lVar8 = lVar4 + 1;
          } while (lVar8 < (long)(len - (ulong)(seplen - 1)));
        }
        else {
          uVar5 = 0;
          lVar7 = 0;
        }
        pcVar3 = sdsnewlen(s + lVar7,len - lVar7);
        __ptr[(int)uVar5] = pcVar3;
        if (pcVar3 == (sds)0x0) {
LAB_018560fd:
          if (0 < (int)uVar5) {
            uVar9 = 0;
            do {
              sdsfree(__ptr[uVar9]);
              uVar9 = uVar9 + 1;
            } while (uVar5 != uVar9);
          }
          free(__ptr);
          iVar6 = 0;
          __ptr = (sds *)0x0;
        }
        else {
          iVar6 = uVar5 + 1;
        }
      }
      *count = iVar6;
      return __ptr;
    }
  }
  return (sds *)0x0;
}

Assistant:

sds *sdssplitlen(const char *s, ssize_t len, const char *sep, int seplen, int *count) {
    int elements = 0, slots = 5;
    long start = 0, j;
    sds *tokens;

    if (seplen < 1 || len < 0) return NULL;

    tokens = (sds*) malloc(sizeof(sds)*slots);
    if (tokens == NULL) return NULL;

    if (len == 0) {
        *count = 0;
        return tokens;
    }
    for (j = 0; j < (len-(seplen-1)); j++) {
        /* make sure there is room for the next element and the final one */
        if (slots < elements+2) {
            sds *newtokens;

            slots *= 2;
            newtokens = (sds*) realloc(tokens,sizeof(sds)*slots);
            if (newtokens == NULL) goto cleanup;
            tokens = newtokens;
        }
        /* search the separator */
        if ((seplen == 1 && *(s+j) == sep[0]) || (memcmp(s+j,sep,seplen) == 0)) {
            tokens[elements] = sdsnewlen(s+start,j-start);
            if (tokens[elements] == NULL) goto cleanup;
            elements++;
            start = j+seplen;
            j = j+seplen-1; /* skip the separator */
        }
    }
    /* Add the final element. We are sure there is room in the tokens array. */
    tokens[elements] = sdsnewlen(s+start,len-start);
    if (tokens[elements] == NULL) goto cleanup;
    elements++;
    *count = elements;
    return tokens;

cleanup:
    {
        int i;
        for (i = 0; i < elements; i++) sdsfree(tokens[i]);
        free(tokens);
        *count = 0;
        return NULL;
    }
}